

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# create_spectrum.cpp
# Opt level: O1

Spectrum *
window_standards::create_spectrum
          (Spectrum *__return_storage_ptr__,string *line,string *standard_directory)

{
  string *this;
  int iVar1;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var2;
  pointer pcVar3;
  char *pcVar4;
  bool bVar5;
  size_type sVar6;
  pointer psVar7;
  int *piVar8;
  undefined8 uVar9;
  size_type __len2;
  Spectrum_Type SVar10;
  double dVar11;
  string spectum_path;
  string a;
  string b;
  regex pattern;
  undefined1 local_108 [40];
  char *local_e0;
  undefined8 local_d8;
  char local_d0;
  undefined7 uStack_cf;
  char *local_c0;
  undefined8 local_b8;
  char local_b0;
  undefined7 uStack_af;
  double *local_a0;
  string *local_98;
  char *local_90;
  Spectrum local_88;
  
  this = &__return_storage_ptr__->description;
  (__return_storage_ptr__->description)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->description).field_2;
  SVar10 = NONE;
  (__return_storage_ptr__->description)._M_string_length = 0;
  (__return_storage_ptr__->description).field_2._M_local_buf[0] = '\0';
  __return_storage_ptr__->t = NAN;
  __return_storage_ptr__->a = NAN;
  __return_storage_ptr__->b = NAN;
  (__return_storage_ptr__->values).
  super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->values).
  super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->values).
  super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pcVar4 = "TestCreateSpectrum_None";
  __len2 = 4;
  local_98 = standard_directory;
  sVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                    (line,"None",0,4);
  if (sVar6 != 0xffffffffffffffff) {
LAB_00131e1a:
    __return_storage_ptr__->type = SVar10;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
              (this,0,(__return_storage_ptr__->description)._M_string_length,pcVar4 + 0x13,__len2);
    return __return_storage_ptr__;
  }
  sVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                    (line,"Blackbody",0,9);
  if ((sVar6 == 0xffffffffffffffff) ||
     (sVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                        (line,".SSP",0,4), sVar6 != 0xffffffffffffffff)) {
    sVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                      (line,"UV Action",0,9);
    if ((sVar6 == 0xffffffffffffffff) ||
       (sVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                find(line,".SSP",0,4), sVar6 != 0xffffffffffffffff)) {
      pcVar4 = "TestCreateSpectrum_Krochmann";
      __len2 = 9;
      local_a0 = &__return_storage_ptr__->t;
      sVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                        (line,"Krochmann",0,9);
      if (sVar6 != 0xffffffffffffffff) {
        sVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                find(line,".SSP",0,4);
        SVar10 = KROCHMANN;
        if (sVar6 == 0xffffffffffffffff) goto LAB_00131e1a;
      }
      pcVar3 = (local_98->_M_dataplus)._M_p;
      local_108._0_8_ = (pointer)(local_108 + 0x10);
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_108,pcVar3,pcVar3 + local_98->_M_string_length);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_108,
                 (line->_M_dataplus)._M_p,line->_M_string_length);
      load_spectrum(&local_88,(string *)local_108);
      __return_storage_ptr__->type = local_88.type;
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (this,&local_88.description);
      *(undefined4 *)local_a0 = local_88.t._0_4_;
      *(undefined4 *)((long)local_a0 + 4) = local_88.t._4_4_;
      *(undefined4 *)(local_a0 + 1) = local_88.a._0_4_;
      *(undefined4 *)((long)local_a0 + 0xc) = local_88.a._4_4_;
      local_a0[2] = local_88.b;
      std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
      _M_move_assign(&__return_storage_ptr__->values,&local_88.values);
      if (local_88.values.
          super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_88.values.
                        super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_88.values.
                              super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_88.values.
                              super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88.description._M_dataplus._M_p != &local_88.description.field_2) {
        operator_delete(local_88.description._M_dataplus._M_p,
                        local_88.description.field_2._M_allocated_capacity + 1);
      }
      if ((pointer)local_108._0_8_ == (pointer)(local_108 + 0x10)) {
        return __return_storage_ptr__;
      }
      operator_delete((void *)local_108._0_8_,(ulong)(local_108._16_8_ + 1));
      return __return_storage_ptr__;
    }
    __return_storage_ptr__->type = UV_ACTION;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
              (this,0,(__return_storage_ptr__->description)._M_string_length,"UV Action",9);
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
              ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&local_88,
               ".*a=(.*), b=(.*)\\)",0x10);
    local_108._16_8_ = (pointer)0x0;
    local_108._24_8_ = (char *)0x0;
    local_108._0_8_ = (pointer)0x0;
    local_108._8_8_ = (pointer)0x0;
    _Var2._M_current = (line->_M_dataplus)._M_p;
    bVar5 = std::__detail::
            __regex_algo_impl<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>,(std::__detail::_RegexExecutorPolicy)0,false>
                      (_Var2,(__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              )(_Var2._M_current + line->_M_string_length),
                       (match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                        *)local_108,
                       (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&local_88,0);
    if (!bVar5) goto LAB_0013228d;
    if (local_108._0_8_ == local_108._8_8_) {
      bVar5 = false;
    }
    else {
      bVar5 = ((long)(local_108._8_8_ - local_108._0_8_) >> 3) * -0x5555555555555555 - 5U <
              0xfffffffffffffffe;
    }
    psVar7 = (pointer)(local_108._8_8_ + -0x48);
    if (bVar5) {
      psVar7 = (pointer)(local_108._0_8_ + 0x18);
    }
    if (psVar7->matched == true) {
      local_e0 = &local_d0;
      std::__cxx11::string::
      _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                ((string *)&local_e0,
                 (psVar7->
                 super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ).first._M_current,
                 (psVar7->
                 super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ).second._M_current);
    }
    else {
      local_e0 = &local_d0;
      local_d8 = 0;
      local_d0 = '\0';
    }
    if (local_108._0_8_ == local_108._8_8_) {
      bVar5 = false;
    }
    else {
      bVar5 = ((long)(local_108._8_8_ - local_108._0_8_) >> 3) * -0x5555555555555555 - 6U <
              0xfffffffffffffffd;
    }
    psVar7 = (pointer)(local_108._8_8_ + -0x48);
    if (bVar5) {
      psVar7 = (pointer)(local_108._0_8_ + 0x30);
    }
    local_c0 = &local_b0;
    if (psVar7->matched == true) {
      std::__cxx11::string::
      _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                ((string *)&local_c0,
                 (psVar7->
                 super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ).first._M_current,
                 (psVar7->
                 super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ).second._M_current);
    }
    else {
      local_b8 = 0;
      local_b0 = '\0';
    }
    pcVar4 = local_e0;
    piVar8 = __errno_location();
    iVar1 = *piVar8;
    *piVar8 = 0;
    dVar11 = strtod(pcVar4,&local_90);
    if (local_90 == pcVar4) goto LAB_001322c1;
    if (*piVar8 == 0) {
LAB_0013220a:
      *piVar8 = iVar1;
    }
    else if (*piVar8 == 0x22) {
      dVar11 = (double)std::__throw_out_of_range("stod");
      goto LAB_0013220a;
    }
    pcVar4 = local_c0;
    __return_storage_ptr__->a = dVar11;
    iVar1 = *piVar8;
    *piVar8 = 0;
    dVar11 = strtod(local_c0,&local_90);
    if (local_90 == pcVar4) {
LAB_001322cd:
      uVar9 = std::__throw_invalid_argument("stod");
      if (local_e0 != &local_d0) {
        operator_delete(local_e0,CONCAT71(uStack_cf,local_d0) + 1);
      }
      if ((pointer)local_108._0_8_ != (pointer)0x0) {
        operator_delete((void *)local_108._0_8_,local_108._16_8_ - local_108._0_8_);
      }
      std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
                ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&local_88);
      Spectrum::~Spectrum(__return_storage_ptr__);
      _Unwind_Resume(uVar9);
    }
    if (*piVar8 == 0) {
LAB_00132253:
      *piVar8 = iVar1;
    }
    else if (*piVar8 == 0x22) {
      dVar11 = (double)std::__throw_out_of_range("stod");
      goto LAB_00132253;
    }
    __return_storage_ptr__->b = dVar11;
    if (local_c0 != &local_b0) {
      operator_delete(local_c0,CONCAT71(uStack_af,local_b0) + 1);
    }
  }
  else {
    __return_storage_ptr__->type = BLACKBODY;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
              (this,0,(__return_storage_ptr__->description)._M_string_length,"Blackbody",9);
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
              ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&local_88,".*T=(.*)K\\)",0x10
              );
    local_108._16_8_ = (pointer)0x0;
    local_108._24_8_ = (char *)0x0;
    local_108._0_8_ = (pointer)0x0;
    local_108._8_8_ = (pointer)0x0;
    _Var2._M_current = (line->_M_dataplus)._M_p;
    bVar5 = std::__detail::
            __regex_algo_impl<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>,(std::__detail::_RegexExecutorPolicy)0,false>
                      (_Var2,(__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              )(_Var2._M_current + line->_M_string_length),
                       (match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                        *)local_108,
                       (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&local_88,0);
    if (!bVar5) goto LAB_0013228d;
    if (local_108._0_8_ == local_108._8_8_) {
      bVar5 = false;
    }
    else {
      bVar5 = ((long)(local_108._8_8_ - local_108._0_8_) >> 3) * -0x5555555555555555 - 5U <
              0xfffffffffffffffe;
    }
    psVar7 = (pointer)(local_108._8_8_ + -0x48);
    if (bVar5) {
      psVar7 = (pointer)(local_108._0_8_ + 0x18);
    }
    if (psVar7->matched == true) {
      local_e0 = &local_d0;
      std::__cxx11::string::
      _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                ((string *)&local_e0,
                 (psVar7->
                 super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ).first._M_current,
                 (psVar7->
                 super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ).second._M_current);
    }
    else {
      local_e0 = &local_d0;
      local_d8 = 0;
      local_d0 = '\0';
    }
    pcVar4 = local_e0;
    piVar8 = __errno_location();
    iVar1 = *piVar8;
    *piVar8 = 0;
    dVar11 = strtod(pcVar4,&local_c0);
    if (local_c0 == pcVar4) {
      std::__throw_invalid_argument("stod");
LAB_001322c1:
      std::__throw_invalid_argument("stod");
      goto LAB_001322cd;
    }
    if (*piVar8 == 0) {
LAB_001320f8:
      *piVar8 = iVar1;
    }
    else if (*piVar8 == 0x22) {
      dVar11 = (double)std::__throw_out_of_range("stod");
      goto LAB_001320f8;
    }
    __return_storage_ptr__->t = dVar11;
  }
  if (local_e0 != &local_d0) {
    operator_delete(local_e0,CONCAT71(uStack_cf,local_d0) + 1);
  }
LAB_0013228d:
  if ((pointer)local_108._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_108._0_8_,local_108._16_8_ - local_108._0_8_);
  }
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
            ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&local_88);
  return __return_storage_ptr__;
}

Assistant:

Spectrum create_spectrum(std::string const & line, std::string const & standard_directory)
    {
        Spectrum spectrum;

        if(line.find("None") != std::string::npos)
        {
            spectrum.type = Spectrum_Type::NONE;
            spectrum.description = "None";
        }
        else if(line.find("Blackbody") != std::string::npos && line.find(".SSP") == std::string::npos)
        {
            spectrum.type = Spectrum_Type::BLACKBODY;
            spectrum.description = "Blackbody";

            std::regex pattern(".*T=(.*)K\\)");
            // auto itr = std::sregex_iterator(line.begin(), line.end(), pattern);
            // std::string val = itr->str();
            std::smatch matches;
            if(std::regex_search(line, matches, pattern))
            {
                std::string val = matches[1].str();
                spectrum.t = std::stod(val);
            }
        }
        else if(line.find("UV Action") != std::string::npos && line.find(".SSP") == std::string::npos)
        {
            spectrum.type = Spectrum_Type::UV_ACTION;
            spectrum.description = "UV Action";
            std::regex pattern(".*a=(.*), b=(.*)\\)");
            // auto itr = std::sregex_iterator(line.begin(), line.end(), pattern);
            // std::string a = itr->str(1);
            // std::string a = itr->str(2);
            std::smatch matches;
            if(std::regex_search(line, matches, pattern))
            {
                std::string a = matches[1].str();
                std::string b = matches[2].str();
                spectrum.a = std::stod(a);
                spectrum.b = std::stod(b);
            }
        }
        else if((line.find("Krochmann") != std::string::npos) && (line.find(".SSP") == std::string::npos))
        {
            spectrum.type = Spectrum_Type::KROCHMANN;
            spectrum.description = "Krochmann";
        }
        else
        {
            std::string spectum_path = standard_directory;
            spectum_path += line;
            spectrum = load_spectrum(spectum_path);
        }

        return spectrum;
    }